

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<double,double,double,duckdb::BinaryStandardOperatorWrapper,duckdb::PowOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  byte fun_00;
  bool bVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  byte in_CL;
  Vector *in_RDX;
  undefined8 in_RDI;
  double dVar5;
  Vector *unaff_retaddr;
  double *result_data;
  double *rdata;
  double *ldata;
  ValidityMask *in_stack_ffffffffffffffa8;
  double left_00;
  undefined8 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 is_null;
  
  is_null = (undefined1)((ulong)in_RDI >> 0x38);
  fun_00 = in_CL & 1;
  Vector::SetVectorType
            ((Vector *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
             (VectorType)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
  pdVar2 = ConstantVector::GetData<double>((Vector *)0x20b84a4);
  pdVar3 = ConstantVector::GetData<double>((Vector *)0x20b84b3);
  pdVar4 = ConstantVector::GetData<double>((Vector *)0x20b84c2);
  bVar1 = ConstantVector::IsNull((Vector *)0x20b84d1);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x20b84df), !bVar1)) {
    dVar5 = *pdVar2;
    left_00 = *pdVar3;
    ConstantVector::Validity(in_RDX);
    dVar5 = BinaryStandardOperatorWrapper::Operation<bool,duckdb::PowOperator,double,double,double>
                      ((bool)fun_00,left_00,dVar5,in_stack_ffffffffffffffa8,0x20b8547);
    *pdVar4 = dVar5;
    return;
  }
  ConstantVector::SetNull(unaff_retaddr,(bool)is_null);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}